

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
::
transit_state<afsm::test::json_parser_def::context::array::value,afsm::test::json_parser_def::context::array::value,afsm::test::events::comma,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array::value,afsm::test::events::comma,afsm::none>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array::value,afsm::test::json_parser_def::context::array::value>,afsm::transitions::detail::state_exit<afsm::inner_state_machine<afsm::test::json_parser_def::context::arr___state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
           *this,comma *event)

{
  afsm::detail::pushdown_state<afsm::test::json_parser_def::context::array::value>::
  state_enter<afsm::test::events::comma,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>
            ((pushdown_state<afsm::test::json_parser_def::context::array::value> *)(this + 0x10),
             event,*(inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                     **)this);
  *(undefined8 *)(this + 8) = 0;
  return process;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }